

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall
crnd::static_huffman_data_model::prepare_decoder_tables(static_huffman_data_model *this)

{
  int iVar1;
  decoder_tables *this_00;
  uint uVar2;
  
  uVar2 = (this->m_code_sizes).m_size;
  this->m_total_syms = uVar2;
  this_00 = this->m_pDecode_tables;
  if (this_00 == (decoder_tables *)0x0) {
    this_00 = crnd_new<crnd::prefix_coding::decoder_tables>();
    this->m_pDecode_tables = this_00;
    uVar2 = this->m_total_syms;
  }
  compute_decoder_table_bits(this);
  iVar1 = prefix_coding::decoder_tables::init(this_00,(EVP_PKEY_CTX *)(ulong)uVar2);
  return SUB41(iVar1,0);
}

Assistant:

bool static_huffman_data_model::prepare_decoder_tables()
    {
        uint32 total_syms = m_code_sizes.size();

        CRND_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms));

        m_total_syms = total_syms;

        if (!m_pDecode_tables)
            m_pDecode_tables = crnd_new<prefix_coding::decoder_tables>();

        return m_pDecode_tables->init(m_total_syms, &m_code_sizes[0], compute_decoder_table_bits());
    }